

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::IndirectBuffer::ReadSupport::initPrograms
          (ReadSupport *this,SourceCollections *programCollection)

{
  ostream *poVar1;
  char *pcVar2;
  ProgramSources *pPVar3;
  string local_950;
  ShaderSource local_930;
  allocator<char> local_901;
  string local_900;
  string local_8e0 [32];
  string local_8c0 [32];
  ostringstream local_8a0 [8];
  ostringstream src_2;
  string local_728;
  ShaderSource local_708;
  allocator<char> local_6d9;
  string local_6d8;
  ostringstream local_6b8 [8];
  ostringstream src_1;
  string local_540;
  ShaderSource local_520;
  allocator<char> local_4f1;
  string local_4f0;
  string local_4d0 [32];
  string local_4b0 [32];
  ostringstream local_490 [8];
  ostringstream src;
  ostringstream local_318 [8];
  ostringstream main;
  ostringstream local_190 [8];
  ostringstream decl;
  SourceCollections *programCollection_local;
  ReadSupport *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,
                           "layout(set = 0, binding = 0, std140) coherent buffer Data {\n");
  poVar1 = std::operator<<(poVar1,"    uint value;\n");
  std::operator<<(poVar1,"} sb_out;\n");
  std::__cxx11::ostringstream::ostringstream(local_318);
  std::operator<<((ostream *)local_318,"    atomicAdd(sb_out.value, 1u);\n");
  std::__cxx11::ostringstream::ostringstream(local_490);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
  poVar1 = std::operator<<((ostream *)local_490,pcVar2);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in vec4 v_in_position;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"out ");
  poVar1 = std::operator<<(poVar1,"gl_PerVertex {\n    vec4 gl_Position;\n}");
  poVar1 = std::operator<<(poVar1,";\n");
  poVar1 = std::operator<<(poVar1,"\n");
  std::__cxx11::ostringstream::str();
  poVar1 = std::operator<<(poVar1,local_4b0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"    gl_Position = v_in_position;\n");
  std::__cxx11::ostringstream::str();
  poVar1 = std::operator<<(poVar1,local_4d0);
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::~string(local_4d0);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"read_ib_vert",&local_4f1)
  ;
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_4f0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_520,&local_540);
  glu::ProgramSources::operator<<(pPVar3,&local_520);
  glu::VertexSource::~VertexSource((VertexSource *)&local_520);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::__cxx11::ostringstream::~ostringstream(local_490);
  std::__cxx11::ostringstream::ostringstream(local_6b8);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
  poVar1 = std::operator<<((ostream *)local_6b8,pcVar2);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out vec4 o_color;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"    o_color = vec4(1.0);\n");
  std::operator<<(poVar1,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"read_ib_frag",&local_6d9)
  ;
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_6d8);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_708,&local_728);
  glu::ProgramSources::operator<<(pPVar3,&local_708);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_708);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  std::__cxx11::ostringstream::~ostringstream(local_6b8);
  std::__cxx11::ostringstream::ostringstream(local_8a0);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
  poVar1 = std::operator<<((ostream *)local_8a0,pcVar2);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"layout(local_size_x = 1) in;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  std::__cxx11::ostringstream::str();
  poVar1 = std::operator<<(poVar1,local_8c0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  std::__cxx11::ostringstream::str();
  poVar1 = std::operator<<(poVar1,local_8e0);
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::~string(local_8e0);
  std::__cxx11::string::~string(local_8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,"read_ib_comp",&local_901)
  ;
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_900);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_930,&local_950);
  glu::ProgramSources::operator<<(pPVar3,&local_930);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_930);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::~string((string *)&local_900);
  std::allocator<char>::~allocator(&local_901);
  std::__cxx11::ostringstream::~ostringstream(local_8a0);
  std::__cxx11::ostringstream::~ostringstream(local_318);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection) const
	{
		std::ostringstream decl;
		decl << "layout(set = 0, binding = 0, std140) coherent buffer Data {\n"
			 << "    uint value;\n"
			 << "} sb_out;\n";

		std::ostringstream main;
		main << "    atomicAdd(sb_out.value, 1u);\n";

		// Vertex
		{
			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
				<< "\n"
				<< "layout(location = 0) in vec4 v_in_position;\n"
				<< "\n"
				<< "out " << s_perVertexBlock << ";\n"
				<< "\n"
				<< decl.str()
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "    gl_Position = v_in_position;\n"
				<< main.str()
				<< "}\n";

			programCollection.glslSources.add("read_ib_vert") << glu::VertexSource(src.str());
		}

		// Fragment
		{
			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
				<< "\n"
				<< "layout(location = 0) out vec4 o_color;\n"
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "    o_color = vec4(1.0);\n"
				<< "}\n";

			programCollection.glslSources.add("read_ib_frag") << glu::FragmentSource(src.str());
		}

		// Compute
		{
			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
				<< "\n"
				<< "layout(local_size_x = 1) in;\n"
				<< "\n"
				<< decl.str()
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< main.str()
				<< "}\n";

			programCollection.glslSources.add("read_ib_comp") << glu::ComputeSource(src.str());
		}
	}